

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O2

char * flatcc_json_parser_array_start(flatcc_json_parser_t *ctx,char *buf,char *end,int *more)

{
  char *pcVar1;
  
  if ((buf == end) || (*buf != '[')) {
    *more = 0;
    if (ctx->error == 0) {
      ctx->error = 0x16;
      ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
      ctx->error_loc = buf;
    }
  }
  else {
    pcVar1 = flatcc_json_parser_space(ctx,buf + 1,end);
    if ((pcVar1 != end) && (*pcVar1 == ']')) {
      *more = 0;
      pcVar1 = flatcc_json_parser_space(ctx,pcVar1 + 1,end);
      return pcVar1;
    }
    *more = 1;
    end = pcVar1;
  }
  return end;
}

Assistant:

static inline const char *flatcc_json_parser_array_start(flatcc_json_parser_t *ctx, const char *buf, const char *end, int *more)
{
    if (buf == end || *buf != '[') {
        *more = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_expected_array);
    }
    buf = flatcc_json_parser_space(ctx, buf + 1, end);
    if (buf != end && *buf == ']') {
        *more = 0;
        return flatcc_json_parser_space(ctx, buf + 1, end);
    }
    *more = 1;
    return buf;
}